

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servnotf.cpp
# Opt level: O2

void __thiscall icu_63::ICUNotifier::notifyChanged(ICUNotifier *this)

{
  void *pvVar1;
  int index;
  int iVar2;
  Mutex lmx;
  Mutex local_20;
  
  if (this->listeners != (UVector *)0x0) {
    local_20.fMutex = (UMutex *)notifyLock;
    umtx_lock_63((UMutex *)notifyLock);
    if (this->listeners != (UVector *)0x0) {
      iVar2 = this->listeners->count;
      index = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
        index = 0;
      }
      for (; iVar2 != index; index = index + 1) {
        pvVar1 = UVector::elementAt(this->listeners,index);
        (*this->_vptr_ICUNotifier[6])(this,pvVar1);
      }
    }
    Mutex::~Mutex(&local_20);
  }
  return;
}

Assistant:

void 
ICUNotifier::notifyChanged(void) 
{
    if (listeners != NULL) {
        Mutex lmx(&notifyLock);
        if (listeners != NULL) {
            for (int i = 0, e = listeners->size(); i < e; ++i) {
                EventListener* el = (EventListener*)listeners->elementAt(i);
                notifyListener(*el);
            }
        }
    }
}